

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O1

void nn_mutex_reset(nn_mutex *self)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  undefined8 *puVar3;
  
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)self);
  if (iVar1 == 0) {
    pthread_mutex_destroy((pthread_mutex_t *)self);
    iVar1 = pthread_mutex_init((pthread_mutex_t *)self,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      uVar2 = pthread_mutex_lock((pthread_mutex_t *)self);
      if (uVar2 == 0) {
        return;
      }
      goto LAB_00124061;
    }
  }
  else {
    nn_mutex_reset_cold_1();
  }
  nn_mutex_reset_cold_2();
  uVar2 = extraout_EAX;
LAB_00124061:
  puVar3 = (undefined8 *)(ulong)uVar2;
  nn_mutex_reset_cold_3();
  *puVar3 = 0;
  puVar3[1] = 0;
  return;
}

Assistant:

void nn_mutex_reset (struct nn_mutex *self)
{
    int rc;

    rc = pthread_mutex_unlock (&self->mutex);
    errnum_assert (rc == 0, rc);
    pthread_mutex_destroy (&self->mutex);

    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_lock (&self->mutex);
    errnum_assert (rc == 0, rc);
}